

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restincurl.h
# Opt level: O0

void __thiscall restincurl::Worker::CloseWhenFinished(Worker *this)

{
  lock_guard<std::mutex> local_18;
  lock_t lock;
  Worker *this_local;
  
  lock._M_device = (mutex_type *)this;
  std::lock_guard<std::mutex>::lock_guard(&local_18,&this->mutex_);
  this->close_pending_ = true;
  std::lock_guard<std::mutex>::~lock_guard(&local_18);
  Signal(this);
  return;
}

Assistant:

void CloseWhenFinished() {
            {
                lock_t lock(mutex_);
                close_pending_ = true;
            }
            Signal();
        }